

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_frame_buffer_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_117e0d7::ExternalFrameBufferTest::SetUp(ExternalFrameBufferTest *this)

{
  char cVar1;
  size_type sVar2;
  WebMVideoSource *this_00;
  AV1Decoder *pAVar3;
  pointer *__ptr;
  SEARCH_METHODS *pSVar4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  AssertHelper local_50;
  string local_48;
  
  this_00 = (WebMVideoSource *)operator_new(0x58);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"av1-1-b8-03-sizeup.mkv","");
  libaom_test::WebMVideoSource::WebMVideoSource(this_00,&local_48);
  this->video_ = (CompressedVideoSource *)this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<libaom_test::CompressedVideoSource*,decltype(nullptr)>
            ((internal *)&local_48,"video_","nullptr",&this->video_,&local_58._M_head_impl);
  cVar1 = (char)local_48._M_dataplus._M_p;
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)local_48._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/external_frame_buffer_test.cc"
               ,0x140,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  sVar2 = local_48._M_string_length;
  if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_48._M_string_length !=
        (undefined8 *)(local_48._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_48._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  if (cVar1 != '\0') {
    (*this->video_->_vptr_CompressedVideoSource[2])();
    (*this->video_->_vptr_CompressedVideoSource[3])();
    pAVar3 = (AV1Decoder *)operator_new(0x60);
    (pAVar3->super_Decoder).cfg_.h = 0;
    (pAVar3->super_Decoder).cfg_.allow_lowbitdepth = 1;
    (pAVar3->super_Decoder).flags_ = 0;
    (pAVar3->super_Decoder).init_done_ = false;
    (pAVar3->super_Decoder).decoder_.name = (char *)0x0;
    (pAVar3->super_Decoder).decoder_.iface = (aom_codec_iface_t *)0x0;
    *(undefined8 *)&(pAVar3->super_Decoder).decoder_.err = 0;
    (pAVar3->super_Decoder).decoder_.err_detail = (char *)0x0;
    (pAVar3->super_Decoder).decoder_.init_flags = 0;
    (pAVar3->super_Decoder).decoder_.config.dec = (aom_codec_dec_cfg *)0x0;
    (pAVar3->super_Decoder).decoder_.priv = (aom_codec_priv_t *)0x0;
    (pAVar3->super_Decoder).cfg_.threads = 0;
    (pAVar3->super_Decoder).cfg_.w = 0;
    (pAVar3->super_Decoder)._vptr_Decoder = (_func_int **)&PTR__Decoder_00ff7898;
    this->decoder_ = pAVar3;
    local_58._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<libaom_test::AV1Decoder*,decltype(nullptr)>
              ((internal *)&local_48,"decoder_","nullptr",&this->decoder_,&local_58._M_head_impl);
    if ((char)local_48._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_58);
      if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = *(SEARCH_METHODS **)local_48._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/external_frame_buffer_test.cc"
                 ,0x147,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_58._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))();
      }
    }
    if ((undefined8 *)local_48._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_48._M_string_length !=
          (undefined8 *)(local_48._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_48._M_string_length);
      }
      operator_delete((void *)local_48._M_string_length);
    }
  }
  return;
}

Assistant:

void SetUp() override {
    video_ = new libaom_test::WebMVideoSource(kAV1TestFile);
    ASSERT_NE(video_, nullptr);
    video_->Init();
    video_->Begin();

    aom_codec_dec_cfg_t cfg = aom_codec_dec_cfg_t();
    cfg.allow_lowbitdepth = !FORCE_HIGHBITDEPTH_DECODING;
    decoder_ = new libaom_test::AV1Decoder(cfg, 0);
    ASSERT_NE(decoder_, nullptr);
  }